

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeErrorConstructor
               (DynamicObject *constructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  ScriptContext *this;
  PropertyString *pPVar2;
  
  DeferredTypeHandlerBase::Convert(typeHandler,constructor,mode,4,0);
  pJVar1 = (((constructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  this = (pJVar1->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (constructor,0x124,(pJVar1->super_JavascriptLibraryBase).errorPrototype.ptr,0,0,0,0);
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(constructor,0xd1,&DAT_1000000000001,2,0,0,0);
  pPVar2 = ScriptContext::GetPropertyString(this,0x7f);
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(constructor,0x106,pPVar2,2,0,0,0);
  if (((this->config).threadConfig)->m_errorStackTrace == true) {
    (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(constructor,0x162,0x100000000000a,7,0,0,0);
  }
  DynamicObject::SetHasNoEnumerableProperties(constructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeErrorConstructor(DynamicObject* constructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(constructor, mode, 4);

        ScriptContext* scriptContext = constructor->GetScriptContext();
        JavascriptLibrary* library = constructor->GetLibrary();

        library->AddMember(constructor, PropertyIds::prototype, library->errorPrototype, PropertyNone);
        library->AddMember(constructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(constructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Error), PropertyConfigurable);

        if (scriptContext->GetConfig()->IsErrorStackTraceEnabled())
        {
            library->AddMember(constructor, PropertyIds::stackTraceLimit, JavascriptNumber::ToVar(JavascriptExceptionOperators::DefaultStackTraceLimit, scriptContext), PropertyConfigurable | PropertyWritable | PropertyEnumerable);
        }

        constructor->SetHasNoEnumerableProperties(true);

        return true;
    }